

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
ir_assignment::ir_assignment(ir_assignment *this,ir_rvalue *lhs,ir_rvalue *rhs,ir_rvalue *condition)

{
  byte bVar1;
  glsl_type *pgVar2;
  
  (this->super_ir_instruction).super_exec_node.next = (exec_node *)0x0;
  (this->super_ir_instruction).super_exec_node.prev = (exec_node *)0x0;
  (this->super_ir_instruction).ir_type = ir_type_assignment;
  (this->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&PTR__ir_instruction_0025c508;
  this->condition = condition;
  this->rhs = rhs;
  pgVar2 = rhs->type;
  bVar1 = pgVar2->vector_elements;
  if ((bVar1 < 2) || (pgVar2->matrix_columns != '\x01')) {
    if ((bVar1 == 1) && ((*(uint *)&pgVar2->field_0x4 & 0xfe) < 0xe)) {
      this->field_0x38 = (this->field_0x38 & 0xf0) + 1;
      set_lhs(this,lhs);
      return;
    }
  }
  else if ((*(uint *)&pgVar2->field_0x4 & 0xfc) < 0xc) {
    this->field_0x38 = (this->field_0x38 & 0xf0 | (byte)(-1 << (bVar1 & 0x1f)) & 0xf) ^ 0xf;
    set_lhs(this,lhs);
    return;
  }
  this->field_0x38 = this->field_0x38 & 0xf0;
  set_lhs(this,lhs);
  return;
}

Assistant:

exec_node() : next(NULL), prev(NULL)
   {
      /* empty */
   }